

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O2

void pzshape::TPZShapeCube::ShapeCornerCube(TPZVec<Fad<double>_> *pt,TPZVec<Fad<double>_> *phi)

{
  FADREAL *pFVar1;
  FADREAL *pFVar2;
  long lVar3;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
  local_130;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> local_118;
  FADREAL x [2];
  FADREAL y [2];
  FADREAL z [2];
  
  Fad<double>::Fad(x);
  Fad<double>::Fad(x + 1);
  Fad<double>::Fad(y);
  Fad<double>::Fad(y + 1);
  Fad<double>::Fad(z);
  Fad<double>::Fad(z + 1);
  local_118.fadexpr_.right_ = pt->fStore;
  local_118.fadexpr_.left_.constant_ = 1.0;
  local_118.fadexpr_.left_.defaultVal = 0.0;
  local_130.fadexpr_.right_.constant_ = 2.0;
  local_130.fadexpr_.right_.defaultVal = 0.0;
  local_130.fadexpr_.left_ = &local_118;
  Fad<double>::operator=(x,&local_130);
  local_118.fadexpr_.right_ = pt->fStore;
  local_118.fadexpr_.left_.constant_ = 1.0;
  local_118.fadexpr_.left_.defaultVal = 0.0;
  local_130.fadexpr_.right_.constant_ = 2.0;
  local_130.fadexpr_.right_.defaultVal = 0.0;
  local_130.fadexpr_.left_ = &local_118;
  Fad<double>::operator=
            (x + 1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                    *)&local_130);
  local_118.fadexpr_.right_ = pt->fStore + 1;
  local_118.fadexpr_.left_.constant_ = 1.0;
  local_118.fadexpr_.left_.defaultVal = 0.0;
  local_130.fadexpr_.right_.constant_ = 2.0;
  local_130.fadexpr_.right_.defaultVal = 0.0;
  local_130.fadexpr_.left_ = &local_118;
  Fad<double>::operator=(y,&local_130);
  local_118.fadexpr_.right_ = pt->fStore + 1;
  local_118.fadexpr_.left_.constant_ = 1.0;
  local_118.fadexpr_.left_.defaultVal = 0.0;
  local_130.fadexpr_.right_.constant_ = 2.0;
  local_130.fadexpr_.right_.defaultVal = 0.0;
  local_130.fadexpr_.left_ = &local_118;
  Fad<double>::operator=
            (y + 1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                    *)&local_130);
  local_118.fadexpr_.right_ = pt->fStore + 2;
  local_118.fadexpr_.left_.constant_ = 1.0;
  local_118.fadexpr_.left_.defaultVal = 0.0;
  local_130.fadexpr_.right_.constant_ = 2.0;
  local_130.fadexpr_.right_.defaultVal = 0.0;
  local_130.fadexpr_.left_ = &local_118;
  Fad<double>::operator=(z,&local_130);
  local_118.fadexpr_.right_ = pt->fStore + 2;
  local_118.fadexpr_.left_.constant_ = 1.0;
  local_118.fadexpr_.left_.defaultVal = 0.0;
  local_130.fadexpr_.right_.constant_ = 2.0;
  local_130.fadexpr_.right_.defaultVal = 0.0;
  local_130.fadexpr_.left_ = &local_118;
  Fad<double>::operator=
            (z + 1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                    *)&local_130);
  local_130.fadexpr_.left_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)x;
  local_130.fadexpr_.right_.constant_ = (double)y;
  local_118._0_8_ =
       (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
        *)&local_130;
  local_118.fadexpr_.left_.constant_ = (double)z;
  Fad<double>::operator=
            (phi->fStore,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)&local_118);
  pFVar1 = x + 1;
  local_130.fadexpr_.left_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)pFVar1;
  local_130.fadexpr_.right_.constant_ = (double)y;
  local_118._0_8_ =
       (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
        *)&local_130;
  local_118.fadexpr_.left_.constant_ = (double)z;
  Fad<double>::operator=
            (phi->fStore + 1,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)&local_118);
  local_130.fadexpr_.left_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)pFVar1;
  local_130.fadexpr_.right_.constant_ = (double)(y + 1);
  local_118._0_8_ =
       (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
        *)&local_130;
  local_118.fadexpr_.left_.constant_ = (double)z;
  Fad<double>::operator=
            (phi->fStore + 2,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)&local_118);
  local_130.fadexpr_.left_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)x;
  local_130.fadexpr_.right_.constant_ = (double)(y + 1);
  local_118._0_8_ =
       (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
        *)&local_130;
  local_118.fadexpr_.left_.constant_ = (double)z;
  Fad<double>::operator=
            (phi->fStore + 3,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)&local_118);
  pFVar2 = z + 1;
  local_130.fadexpr_.left_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)x;
  local_130.fadexpr_.right_.constant_ = (double)y;
  local_118._0_8_ =
       (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
        *)&local_130;
  local_118.fadexpr_.left_.constant_ = (double)pFVar2;
  Fad<double>::operator=
            (phi->fStore + 4,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)&local_118);
  local_130.fadexpr_.left_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)pFVar1;
  local_130.fadexpr_.right_.constant_ = (double)y;
  local_118._0_8_ =
       (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
        *)&local_130;
  local_118.fadexpr_.left_.constant_ = (double)pFVar2;
  Fad<double>::operator=
            (phi->fStore + 5,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)&local_118);
  local_130.fadexpr_.left_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)pFVar1;
  local_130.fadexpr_.right_.constant_ = (double)(y + 1);
  local_118._0_8_ =
       (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
        *)&local_130;
  local_118.fadexpr_.left_.constant_ = (double)pFVar2;
  Fad<double>::operator=
            (phi->fStore + 6,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)&local_118);
  local_130.fadexpr_.left_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)x;
  local_130.fadexpr_.right_.constant_ = (double)(y + 1);
  local_118._0_8_ =
       (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
        *)&local_130;
  local_118.fadexpr_.left_.constant_ = (double)pFVar2;
  Fad<double>::operator=
            (phi->fStore + 7,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)&local_118);
  lVar3 = 0x20;
  do {
    Fad<double>::~Fad((Fad<double> *)((long)&z[0].val_ + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  lVar3 = 0x20;
  do {
    Fad<double>::~Fad((Fad<double> *)((long)&y[0].val_ + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  lVar3 = 0x20;
  do {
    Fad<double>::~Fad((Fad<double> *)((long)&x[0].val_ + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  return;
}

Assistant:

void TPZShapeCube::ShapeCornerCube(TPZVec<FADREAL> &pt, TPZVec<FADREAL> &phi)
	{
		FADREAL x[2], y[2], z[2];
		
		x[0]  = (REAL(1.)-pt[0])/REAL(2.);
		x[1]  = (REAL(1.)+pt[0])/REAL(2.);
		y[0]  = (REAL(1.)-pt[1])/REAL(2.);
		y[1]  = (REAL(1.)+pt[1])/REAL(2.);
		z[0]  = (REAL(1.)-pt[2])/REAL(2.);
		z[1]  = (REAL(1.)+pt[2])/REAL(2.);
		
		phi[0]  = x[0]*y[0]*z[0];
		phi[1]  = x[1]*y[0]*z[0];
		phi[2]  = x[1]*y[1]*z[0];
		phi[3]  = x[0]*y[1]*z[0];
		phi[4]  = x[0]*y[0]*z[1];
		phi[5]  = x[1]*y[0]*z[1];
		phi[6]  = x[1]*y[1]*z[1];
		phi[7]  = x[0]*y[1]*z[1];
	}